

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O0

bool __thiscall
Am_Image_Array_Data::Get_RGB_Image(Am_Image_Array_Data *this,uchar *storage,bool top_first)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uchar pixel_3;
  int position_1;
  uchar pixel_2;
  int position;
  int row_width;
  int index_1;
  int col_1;
  int row_1;
  int pixel_1;
  int pixel;
  int index;
  int col;
  int row;
  Am_RGB_Value *ctbl;
  unsigned_short height;
  uchar *puStack_30;
  unsigned_short width;
  uchar *idata;
  uchar *puStack_20;
  bool top_first_local;
  uchar *storage_local;
  Am_Image_Array_Data *this_local;
  
  idata._7_1_ = top_first;
  puStack_20 = storage;
  storage_local = (uchar *)this;
  if ((this->image_ != (Am_Generic_Image *)0x0) ||
     (bVar1 = make_generic_image_from_name(this), bVar1)) {
    puStack_30 = Am_Generic_Image::Get_Data(this->image_);
    if (puStack_30 == (uchar *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      Am_Generic_Image::Get_Size
                (this->image_,(unsigned_short *)((long)&ctbl + 6),
                 (unsigned_short *)((long)&ctbl + 4));
      if (this->name == (char *)0x0) {
        iVar4 = ((ctbl._6_2_ + 7) / 8) * 8;
        position = 0;
        if ((idata._7_1_ & 1) == 0) {
          index_1 = (int)ctbl._4_2_;
          while (index_1 = index_1 - 1, -1 < index_1) {
            for (row_width = 0; row_width < (int)(uint)ctbl._6_2_; row_width = row_width + 1) {
              iVar3 = index_1 * iVar4 + row_width;
              if ((puStack_30[iVar3 / 8] & Get_RGB_Image::byte_array[iVar3 % 8]) == 0) {
                puStack_20[position] = '\0';
                puStack_20[position + 1] = '\0';
                puStack_20[position + 2] = '\0';
              }
              else {
                puStack_20[position] = 0xff;
                puStack_20[position + 1] = 0xff;
                puStack_20[position + 2] = 0xff;
              }
              position = position + 3;
            }
          }
        }
        else {
          for (index_1 = 0; index_1 < (int)(uint)ctbl._4_2_; index_1 = index_1 + 1) {
            for (row_width = 0; row_width < (int)(uint)ctbl._6_2_; row_width = row_width + 1) {
              iVar3 = index_1 * iVar4 + row_width;
              if ((puStack_30[iVar3 / 8] & Get_RGB_Image::byte_array[iVar3 % 8]) == 0) {
                puStack_20[position] = '\0';
                puStack_20[position + 1] = '\0';
                puStack_20[position + 2] = '\0';
              }
              else {
                puStack_20[position] = 0xff;
                puStack_20[position + 1] = 0xff;
                puStack_20[position + 2] = 0xff;
              }
              position = position + 3;
            }
          }
        }
      }
      else {
        Am_Generic_Image::Get_Color_Map(this->image_,(Am_RGB_Value **)&col);
        pixel_1 = 0;
        if ((idata._7_1_ & 1) == 0) {
          index = (int)ctbl._4_2_;
          while (index = index - 1, -1 < index) {
            for (pixel = 0; pixel < (int)(uint)ctbl._6_2_; pixel = pixel + 1) {
              uVar2 = (uint)puStack_30[(int)(index * (uint)ctbl._6_2_ + pixel)];
              puStack_20[pixel_1] = (uchar)_col[(int)uVar2].red;
              iVar4 = pixel_1 + 2;
              puStack_20[pixel_1 + 1] = (uchar)_col[(int)uVar2].green;
              pixel_1 = pixel_1 + 3;
              puStack_20[iVar4] = (uchar)_col[(int)uVar2].blue;
            }
          }
        }
        else {
          for (index = 0; index < (int)(uint)ctbl._4_2_; index = index + 1) {
            for (pixel = 0; pixel < (int)(uint)ctbl._6_2_; pixel = pixel + 1) {
              uVar2 = (uint)puStack_30[(int)(index * (uint)ctbl._6_2_ + pixel)];
              puStack_20[pixel_1] = (uchar)_col[(int)uVar2].red;
              iVar4 = pixel_1 + 2;
              puStack_20[pixel_1 + 1] = (uchar)_col[(int)uVar2].green;
              pixel_1 = pixel_1 + 3;
              puStack_20[iVar4] = (uchar)_col[(int)uVar2].blue;
            }
          }
        }
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
Am_Image_Array_Data::Get_RGB_Image(unsigned char *storage, bool top_first)
{
  if (image_ == nullptr) {
    if (!make_generic_image_from_name())
      return false;
  }

  unsigned char *idata = image_->Get_Data();
  if (idata == nullptr)
    return false;

  unsigned short width, height;
  image_->Get_Size(width, height);

  if (name) {
    // image from file; with colormap
    Am_RGB_Value *ctbl;
    int row, col, index;

    (void)image_->Get_Color_Map(ctbl);
    index = 0;

    if (top_first) {
      // start with row 0 and work "down"
      for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
          int pixel = idata[row * width + col];
          storage[index++] = ctbl[pixel].red;
          storage[index++] = ctbl[pixel].green;
          storage[index++] = ctbl[pixel].blue;
        }
      }
    } else {
      // start with last row and work "up"
      for (row = height - 1; row >= 0; row--) {
        for (col = 0; col < width; col++) {
          int pixel = idata[row * width + col];
          storage[index++] = ctbl[pixel].red;
          storage[index++] = ctbl[pixel].green;
          storage[index++] = ctbl[pixel].blue;
        }
      }
    }
  } else {
    // image from bit data
    // this is how I think X stores bitmaps:
    // - the number of bits in a row is the width of the image is
    //   rounded up to an even multiple of 8
    // - the bits in a byte are stored from right to left !
    int row, col, index;
    static unsigned char byte_array[] = {0x01, 0x02, 0x04, 0x08,
                                         0x10, 0x20, 0x40, 0x80};
    int row_width = (width + 7) / 8 * 8; // round to nearest byte;

    index = 0;
    if (top_first) {
      // start with row 0 and work "down"
      for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
          int position = row * row_width + col;
          unsigned char pixel = idata[position / 8] & byte_array[position % 8];
          if (pixel) {
            storage[index++] = 0xFF;
            storage[index++] = 0xFF;
            storage[index++] = 0xFF;
          } else {
            storage[index++] = 0;
            storage[index++] = 0;
            storage[index++] = 0;
          }
        }
      }
    } else {
      // start with last row and work "up"
      for (row = height - 1; row >= 0; row--) {
        for (col = 0; col < width; col++) {
          int position = row * row_width + col;
          unsigned char pixel = idata[position / 8] & byte_array[position % 8];
          if (pixel) {
            storage[index++] = 0xFF;
            storage[index++] = 0xFF;
            storage[index++] = 0xFF;
          } else {
            storage[index++] = 0;
            storage[index++] = 0;
            storage[index++] = 0;
          }
        }
      }
    }
  }
  return true;
}